

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

uint32 google::protobuf::compiler::cpp::ParseLoopGenerator::ExpectedTag
                 (FieldDescriptor *field,uint32 *fallback_tag_ptr)

{
  uint32 uVar1;
  int iVar2;
  bool bVar3;
  LogMessage *other;
  uint uVar4;
  uint32 uVar5;
  uint32 uVar6;
  FieldDescriptor *local_68;
  code *local_60 [7];
  
  if (*(int *)(field + 0x3c) == 3) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_60[0] = FieldDescriptor::TypeOnceInit;
      local_68 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),local_60,&local_68);
    }
    if (*(int *)(field + 0x38) - 0xdU < 0xfffffffc) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_60[0] = FieldDescriptor::TypeOnceInit;
        local_68 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),local_60,&local_68);
      }
      iVar2 = *(int *)(field + 0x44);
      uVar4 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                       (ulong)*(uint *)(field + 0x38) * 4);
      if (uVar4 == 2) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_60,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
                   ,0x6a8);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_60,
                           "CHECK failed: expected_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED: "
                          );
        internal::LogFinisher::operator=((LogFinisher *)&local_68,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_60);
      }
      uVar5 = iVar2 << 3 | uVar4;
      uVar1 = *(int *)(field + 0x44) * 8 + 2;
      bVar3 = FieldDescriptor::is_packed(field);
      uVar6 = uVar1;
      if (bVar3) {
        uVar6 = uVar5;
        uVar5 = uVar1;
      }
      *fallback_tag_ptr = uVar6;
      return uVar5;
    }
  }
  bVar3 = FieldDescriptor::is_packed(field);
  uVar4 = 2;
  if (!bVar3) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_60[0] = FieldDescriptor::TypeOnceInit;
      local_68 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),local_60,&local_68);
    }
    uVar4 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                     (ulong)*(uint *)(field + 0x38) * 4);
  }
  return *(int *)(field + 0x44) << 3 | uVar4;
}

Assistant:

static uint32 ExpectedTag(const FieldDescriptor* field,
                            uint32* fallback_tag_ptr) {
    uint32 expected_tag;
    if (field->is_packable()) {
      auto expected_wiretype = WireFormat::WireTypeForFieldType(field->type());
      expected_tag =
          WireFormatLite::MakeTag(field->number(), expected_wiretype);
      GOOGLE_CHECK(expected_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      auto fallback_wiretype = WireFormatLite::WIRETYPE_LENGTH_DELIMITED;
      uint32 fallback_tag =
          WireFormatLite::MakeTag(field->number(), fallback_wiretype);

      if (field->is_packed()) std::swap(expected_tag, fallback_tag);
      *fallback_tag_ptr = fallback_tag;
    } else {
      auto expected_wiretype = WireFormat::WireTypeForField(field);
      expected_tag =
          WireFormatLite::MakeTag(field->number(), expected_wiretype);
    }
    return expected_tag;
  }